

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

float theta_kl(lda *l,v_array<float> *Elogtheta,float *gamma)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float local_2c;
  
  v_array<float>::clear(Elogtheta);
  if (l->topics == 0) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    uVar4 = 0;
    do {
      local_2c = lda::digamma(l,gamma[uVar4]);
      v_array<float>::push_back(Elogtheta,&local_2c);
      fVar5 = fVar5 + gamma[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < l->topics);
  }
  fVar6 = lda::digamma(l,fVar5);
  dVar7 = lda::lgamma(l,(double)(ulong)(uint)fVar5);
  uVar4 = l->topics;
  dVar8 = lda::lgamma(l,(double)(ulong)(uint)l->lda_alpha);
  dVar9 = lda::lgamma(l,(double)(ulong)(uint)((float)l->topics * l->lda_alpha));
  fVar5 = (SUB84(dVar9,0) - SUB84(dVar7,0)) - SUB84(dVar8,0) * (float)uVar4;
  if (l->topics != 0) {
    uVar4 = 0;
    do {
      Elogtheta->_begin[uVar4] = Elogtheta->_begin[uVar4] - fVar6;
      fVar1 = l->lda_alpha;
      fVar2 = gamma[uVar4];
      fVar3 = Elogtheta->_begin[uVar4];
      dVar7 = lda::lgamma(l,(double)(ulong)(uint)fVar2);
      fVar5 = SUB84(dVar7,0) + (fVar1 - fVar2) * fVar3 + fVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 < l->topics);
  }
  return fVar5;
}

Assistant:

float theta_kl(lda &l, v_array<float> &Elogtheta, float *gamma)
{
  float gammasum = 0;
  Elogtheta.clear();
  for (size_t k = 0; k < l.topics; k++)
  {
    Elogtheta.push_back(l.digamma(gamma[k]));
    gammasum += gamma[k];
  }
  float digammasum = l.digamma(gammasum);
  gammasum = l.lgamma(gammasum);
  float kl = -(l.topics * l.lgamma(l.lda_alpha));
  kl += l.lgamma(l.lda_alpha * l.topics) - gammasum;
  for (size_t k = 0; k < l.topics; k++)
  {
    Elogtheta[k] -= digammasum;
    kl += (l.lda_alpha - gamma[k]) * Elogtheta[k];
    kl += l.lgamma(gamma[k]);
  }

  return kl;
}